

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::
         do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  int iVar1;
  locale_ref loc_00;
  int iVar2;
  char cVar3;
  type tVar4;
  type tVar5;
  int iVar6;
  appender aVar7;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  sign_t sVar15;
  bool bVar16;
  undefined2 uStack_108;
  char local_106;
  char zero;
  bool pointy;
  undefined3 uStack_103;
  int significand_size;
  sign_t sign;
  locale_ref local_f8;
  ulong local_f0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_e8;
  basic_format_specs<char> *local_e0;
  ulong local_d8;
  char *significand;
  int local_c8;
  int exp;
  char *local_c0;
  float_specs fspecs_local;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = fp->significand;
  iVar6 = fp->significand_size;
  zero = '0';
  sVar15 = fspecs._4_4_ >> 8;
  sign = sVar15 & 0xff;
  bVar16 = sign != none;
  significand_size = iVar6;
  local_f8.locale_ = loc.locale_;
  local_e8 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_e0 = specs;
  local_c0 = significand;
  fspecs_local = fspecs;
  tVar4 = to_unsigned<int>(iVar6);
  local_f0 = (ulong)(bVar16 + tVar4);
  cVar3 = '.';
  local_d8 = (ulong)fspecs >> 0x20;
  if ((fspecs._4_4_ >> 0x11 & 1) != 0) {
    loc_00.locale_._2_1_ = local_106;
    loc_00.locale_._0_2_ = uStack_108;
    loc_00.locale_._3_1_ = zero;
    loc_00.locale_._4_4_ = _pointy;
    cVar3 = decimal_point_impl<char>(loc_00);
  }
  iVar14 = fp->exponent;
  local_c8 = iVar14 + iVar6 + -1;
  local_106 = cVar3;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_c8;
  bVar16 = do_write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char,_fmt::v8::detail::digit_grouping<char>_>
           ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar12 = local_f0;
  uVar11 = fspecs.precision;
  uVar9 = (uint)local_d8;
  if (bVar16) {
    iVar14 = iVar14 + iVar6;
    if ((uVar9 >> 0x14 & 1) == 0) {
      local_f8.locale_ = (void *)((ulong)local_f8.locale_._4_4_ << 0x20);
      if (iVar6 == 1) {
        cVar3 = '\0';
      }
    }
    else {
      local_f8.locale_._0_4_ = 0;
      if (0 < (int)(uVar11 - iVar6)) {
        local_f8.locale_._0_4_ = uVar11 - iVar6;
      }
      tVar4 = to_unsigned<int>((int)local_f8.locale_);
      uVar12 = local_f0 + tVar4;
    }
    iVar2 = local_c8;
    iVar1 = 1 - iVar14;
    if (0 < iVar14) {
      iVar1 = local_c8;
    }
    iVar14 = 2;
    if (99 < iVar1) {
      iVar14 = (999 < iVar1) + 3;
    }
    tVar4 = to_unsigned<int>((3 - (uint)(cVar3 == '\0')) + iVar14);
    write._0_8_ = CONCAT44(write._4_4_,sVar15) & 0xffffffff000000ff;
    write.significand = local_c0;
    write.decimal_point = cVar3;
    write.significand_size = iVar6;
    write._24_5_ = CONCAT14('0',(int)local_f8.locale_);
    write._24_8_ = CONCAT26(write._30_2_,CONCAT15(((uVar9 >> 0x10 & 1) == 0) << 5,write._24_5_)) |
                   0x450000000000;
    write.output_exp = iVar2;
    if (0 < local_e0->width) {
      aVar7 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                        ((appender)local_e8.container,local_e0,uVar12 + tVar4,&write);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    aVar7 = do_write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char,_fmt::v8::detail::digit_grouping<char>_>
            ::anon_class_40_8_dbbf3351::operator()(&write,(iterator)local_e8.container);
    return (appender)
           aVar7.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  iVar1 = fp->exponent;
  iVar14 = iVar1 + iVar6;
  exp = iVar14;
  if (iVar1 < 0) {
    if (iVar14 < 1) {
      uVar10 = -iVar14;
      grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar10;
      if (uVar11 < uVar10) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar11;
      }
      if ((int)uVar11 < 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar10;
      }
      if (iVar6 != 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar10;
      }
      if (iVar6 == 0 && (uint)grouping.sep_.grouping._M_dataplus._M_p == 0) {
        _pointy = CONCAT31(uStack_103,(char)((uVar9 & 0x100000) >> 0x14));
        if ((local_d8 & 0x100000) == 0) {
          iVar6 = 1;
          goto LAB_001188cb;
        }
      }
      else {
        _pointy = CONCAT31(uStack_103,1);
      }
      iVar6 = 2;
LAB_001188cb:
      tVar4 = to_unsigned<int>((uint)grouping.sep_.grouping._M_dataplus._M_p);
      write._0_8_ = &sign;
      write.significand = &zero;
      write._16_8_ = &pointy;
      write._24_8_ = &local_106;
      write._32_8_ = &grouping;
      aVar7 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>
                        ((appender)local_e8.container,local_e0,(iVar6 + tVar4) + uVar12,
                         (anon_class_56_7_162c6e41 *)&write);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    _pointy = uVar11 - iVar6 & (int)(uVar9 << 0xb) >> 0x1f;
    uVar11 = _pointy;
    if ((int)_pointy < 1) {
      uVar11 = 0;
    }
    tVar4 = to_unsigned<int>(uVar11);
    digit_grouping<char>::digit_grouping(&grouping,local_f8,(bool)((byte)(uVar9 >> 0x11) & 1));
    iVar6 = digit_grouping<char>::count_separators(&grouping,significand_size);
    tVar5 = to_unsigned<int>(iVar6);
    write._0_8_ = &sign;
    write.significand = (char *)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = &exp;
    write._32_8_ = &local_106;
    bVar8.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>
                   (local_e8.container,local_e0,local_f0 + tVar5 + (ulong)(tVar4 + 1),
                    (anon_class_64_8_e6ffa566 *)&write);
    goto LAB_0011886f;
  }
  tVar4 = to_unsigned<int>(iVar1);
  lVar13 = tVar4 + local_f0;
  _pointy = uVar11 - iVar14;
  uVar9 = (uint)local_d8;
  if ((uVar9 >> 0x14 & 1) != 0) {
    if ((char)local_d8 == '\x02' || 0 < (int)_pointy) {
      if ((int)_pointy < 1) goto LAB_001187dd;
    }
    else {
      _pointy = 1;
    }
    tVar4 = to_unsigned<int>(_pointy);
    lVar13 = lVar13 + (ulong)(tVar4 + 1);
  }
LAB_001187dd:
  digit_grouping<char>::digit_grouping(&grouping,local_f8,(bool)((byte)(uVar9 >> 0x11) & 1));
  iVar6 = digit_grouping<char>::count_separators(&grouping,significand_size);
  tVar4 = to_unsigned<int>(iVar6);
  write._0_8_ = &sign;
  write.significand = (char *)&significand;
  write._16_8_ = &significand_size;
  write._24_8_ = fp;
  write._32_8_ = &grouping;
  bVar8.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>
                 (local_e8.container,local_e0,lVar13 + (ulong)tVar4,
                  (anon_class_72_9_d68ba176 *)&write);
LAB_0011886f:
  std::__cxx11::string::~string((string *)&grouping);
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar8.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}